

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O2

void __thiscall
event_track::EventMessageInstanceBox::EventMessageInstanceBox
          (EventMessageInstanceBox *this,DASHEventMessageBoxv1 *e,uint64_t pres_time)

{
  uint32_t uVar1;
  
  fmp4_stream::full_box::full_box(&this->super_full_box);
  (this->super_full_box).super_box._vptr_box = (_func_int **)&PTR_size_00122320;
  *(undefined4 *)&(this->super_full_box).field_0x6c = *(undefined4 *)&(e->super_full_box).field_0x6c
  ;
  uVar1 = e->id_;
  this->event_duration_ = e->event_duration_;
  this->id_ = uVar1;
  std::__cxx11::string::string((string *)&this->scheme_id_uri_,(string *)&e->scheme_id_uri_);
  std::__cxx11::string::string((string *)&this->value_,(string *)&e->value_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->message_data_,&e->message_data_);
  this->presentation_time_delta_ = e->presentation_time_ - pres_time;
  return;
}

Assistant:

EventMessageInstanceBox(DASHEventMessageBoxv1 e, uint64_t pres_time)
			: reserved_(e.timescale_), event_duration_(e.event_duration_), \
			id_(e.id_), scheme_id_uri_(e.scheme_id_uri_), \
			value_(e.value_), message_data_(e.message_data_)
		{
			presentation_time_delta_ = e.presentation_time_ - pres_time;
		}